

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsDeprecated(cmGeneratorTarget *this)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  cmValue local_18;
  cmValue deprecation;
  cmGeneratorTarget *this_local;
  
  deprecation.Value = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"DEPRECATION",&local_39);
  local_18 = GetProperty(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = cmNonempty(local_18);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::IsDeprecated() const
{
  cmValue deprecation = this->GetProperty("DEPRECATION");
  return cmNonempty(deprecation);
}